

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

CURLcode proxy_h2_progress_ingress(Curl_cfilter *cf,Curl_easy *data)

{
  cf_h2_proxy_ctx *pcVar1;
  Curl_easy *pCVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  ssize_t sVar6;
  byte local_49;
  ssize_t nread;
  void *pvStack_28;
  CURLcode result;
  cf_h2_proxy_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvStack_28 = cf->ctx;
  nread._4_4_ = CURLE_OK;
  ctx = (cf_h2_proxy_ctx *)data;
  data_local = (Curl_easy *)cf;
  _Var3 = Curl_bufq_is_empty((bufq *)((long)pvStack_28 + 0x10));
  pCVar2 = data_local;
  pcVar1 = ctx;
  if (!_Var3) {
    if ((((ctx != (cf_h2_proxy_ctx *)0x0) &&
         ((*(ulong *)((long)&ctx[8].inbufq.head + 2) >> 0x1c & 1) != 0)) &&
        (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
      sVar5 = Curl_bufq_len((bufq *)((long)pvStack_28 + 0x10));
      Curl_trc_cf_infof((Curl_easy *)pcVar1,(Curl_cfilter *)pCVar2,
                        "[0] process %zu bytes in connection buffer",sVar5);
    }
    iVar4 = proxy_h2_process_pending_input
                      ((Curl_cfilter *)data_local,(Curl_easy *)ctx,(CURLcode *)((long)&nread + 4));
    if (iVar4 < 0) {
      return nread._4_4_;
    }
  }
  while( true ) {
    local_49 = 0;
    if (((*(byte *)((long)pvStack_28 + 0x140) & 1) == 0) &&
       (local_49 = 0, (*(byte *)((long)pvStack_28 + 0x134) >> 1 & 1) == 0)) {
      _Var3 = Curl_bufq_is_empty((bufq *)((long)pvStack_28 + 0x10));
      local_49 = 0;
      if (_Var3) {
        _Var3 = Curl_bufq_is_full((bufq *)((long)pvStack_28 + 0x98));
        local_49 = _Var3 ^ 0xff;
      }
    }
    if ((local_49 & 1) == 0) break;
    sVar6 = Curl_bufq_slurp((bufq *)((long)pvStack_28 + 0x10),proxy_nw_in_reader,data_local,
                            (CURLcode *)((long)&nread + 4));
    pCVar2 = data_local;
    pcVar1 = ctx;
    if (((ctx != (cf_h2_proxy_ctx *)0x0) &&
        ((*(ulong *)((long)&ctx[8].inbufq.head + 2) >> 0x1c & 1) != 0)) &&
       ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      sVar5 = Curl_bufq_len((bufq *)((long)pvStack_28 + 0x10));
      Curl_trc_cf_infof((Curl_easy *)pcVar1,(Curl_cfilter *)pCVar2,
                        "[0] read %zu bytes nw data -> %zd, %d",sVar5,sVar6,(ulong)nread._4_4_);
    }
    if (sVar6 < 0) {
      if (nread._4_4_ != CURLE_AGAIN) {
        Curl_failf((Curl_easy *)ctx,"Failed receiving HTTP2 data");
        return nread._4_4_;
      }
      break;
    }
    if (sVar6 == 0) {
      *(byte *)((long)pvStack_28 + 0x140) = *(byte *)((long)pvStack_28 + 0x140) & 0xfe | 1;
      break;
    }
    iVar4 = proxy_h2_process_pending_input
                      ((Curl_cfilter *)data_local,(Curl_easy *)ctx,(CURLcode *)((long)&nread + 4));
    if (iVar4 != 0) {
      return nread._4_4_;
    }
  }
  if (((*(byte *)((long)pvStack_28 + 0x140) & 1) != 0) &&
     (_Var3 = Curl_bufq_is_empty((bufq *)((long)pvStack_28 + 0x10)), _Var3)) {
    Curl_conncontrol((connectdata *)data_local->prev,1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode proxy_h2_progress_ingress(struct Curl_cfilter *cf,
                                          struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  ssize_t nread;

  /* Process network input buffer fist */
  if(!Curl_bufq_is_empty(&ctx->inbufq)) {
    CURL_TRC_CF(data, cf, "[0] process %zu bytes in connection buffer",
                Curl_bufq_len(&ctx->inbufq));
    if(proxy_h2_process_pending_input(cf, data, &result) < 0)
      return result;
  }

  /* Receive data from the "lower" filters, e.g. network until
   * it is time to stop or we have enough data for this stream */
  while(!ctx->conn_closed &&               /* not closed the connection */
        !ctx->tunnel.closed &&             /* nor the tunnel */
        Curl_bufq_is_empty(&ctx->inbufq) && /* and we consumed our input */
        !Curl_bufq_is_full(&ctx->tunnel.recvbuf)) {

    nread = Curl_bufq_slurp(&ctx->inbufq, proxy_nw_in_reader, cf, &result);
    CURL_TRC_CF(data, cf, "[0] read %zu bytes nw data -> %zd, %d",
                Curl_bufq_len(&ctx->inbufq), nread, result);
    if(nread < 0) {
      if(result != CURLE_AGAIN) {
        failf(data, "Failed receiving HTTP2 data");
        return result;
      }
      break;
    }
    else if(nread == 0) {
      ctx->conn_closed = TRUE;
      break;
    }

    if(proxy_h2_process_pending_input(cf, data, &result))
      return result;
  }

  if(ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    connclose(cf->conn, "GOAWAY received");
  }

  return CURLE_OK;
}